

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O1

void cf_curve25519_mul(uint8_t *q,uint8_t *n,uint8_t *p)

{
  size_t i;
  long lVar1;
  long lVar2;
  int i_1;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  int64_t mask;
  bool bVar10;
  byte bVar11;
  uint8_t z [32];
  gf a;
  gf c;
  gf d;
  gf c_1;
  gf b;
  gf f;
  gf e;
  gf x;
  ulong local_458;
  undefined7 uStack_450;
  undefined1 local_449;
  undefined7 uStack_448;
  undefined8 uStack_441;
  byte local_439;
  ulong local_438 [64];
  ulong local_238 [16];
  int64_t local_1b8 [16];
  int64_t local_138 [16];
  ulong local_b8 [17];
  
  bVar11 = 0;
  uStack_448 = (undefined7)((ulong)*(undefined8 *)(n + 0xf) >> 8);
  uStack_441 = *(undefined8 *)(n + 0x17);
  uStack_450 = (undefined7)*(undefined8 *)(n + 8);
  local_449 = (undefined1)((ulong)*(undefined8 *)(n + 8) >> 0x38);
  local_439 = n[0x1f] & 0x3f | 0x40;
  local_458 = *(ulong *)n & 0xfffffffffffffff8;
  lVar1 = 0;
  do {
    local_b8[lVar1] = (ulong)*(ushort *)(p + lVar1 * 2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  local_b8[0xf] = local_b8[0xf] & 0x7fff;
  local_438[0x10] = 0;
  local_438[0x11] = 0;
  local_438[0x12] = 0;
  local_438[0x13] = 0;
  local_438[0x14] = 0;
  local_438[0x15] = 0;
  local_438[0x16] = 0;
  local_438[0x17] = 0;
  local_438[0x18] = 0;
  local_438[0x19] = 0;
  local_438[0x1a] = 0;
  local_438[0x1b] = 0;
  local_438[0x1c] = 0;
  local_438[0x1d] = 0;
  local_438[0x1e] = 0;
  local_438[0x1f] = 0;
  local_438[0] = 0;
  local_438[1] = 0;
  local_438[2] = 0;
  local_438[3] = 0;
  local_438[4] = 0;
  local_438[5] = 0;
  local_438[6] = 0;
  local_438[7] = 0;
  local_438[8] = 0;
  local_438[9] = 0;
  local_438[10] = 0;
  local_438[0xb] = 0;
  local_438[0xc] = 0;
  local_438[0xd] = 0;
  local_438[0xe] = 0;
  local_438[0xf] = 0;
  local_438[0x2e] = 0;
  local_438[0x2f] = 0;
  local_438[0x2c] = 0;
  local_438[0x2d] = 0;
  local_438[0x2a] = 0;
  local_438[0x2b] = 0;
  local_438[0x28] = 0;
  local_438[0x29] = 0;
  local_438[0x26] = 0;
  local_438[0x27] = 0;
  local_438[0x24] = 0;
  local_438[0x25] = 0;
  local_438[0x22] = 0;
  local_438[0x23] = 0;
  local_438[0x20] = 0;
  local_438[0x21] = 0;
  puVar7 = local_b8;
  puVar6 = local_238;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar6 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar6 = puVar6 + 1;
  }
  local_438[0x20] = 1;
  local_438[0] = 1;
  uVar3 = 0xfe;
  do {
    uVar8 = -(ulong)((*(byte *)((long)&local_458 + (ulong)(uVar3 >> 3)) >> (uVar3 & 7) & 1) != 0);
    lVar1 = 0;
    do {
      uVar5 = (local_238[lVar1] ^ local_438[lVar1]) & uVar8;
      local_438[lVar1] = local_438[lVar1] ^ uVar5;
      local_238[lVar1] = uVar5 ^ local_238[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      uVar5 = (local_438[lVar1 + 0x20] ^ local_438[lVar1 + 0x10]) & uVar8;
      local_438[lVar1 + 0x10] = local_438[lVar1 + 0x10] ^ uVar5;
      local_438[lVar1 + 0x20] = uVar5 ^ local_438[lVar1 + 0x20];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      local_138[lVar1] = local_438[lVar1 + 0x10] + local_438[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      local_438[lVar1] = local_438[lVar1] - local_438[lVar1 + 0x10];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      local_438[lVar1 + 0x10] = local_438[lVar1 + 0x20] + local_238[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      local_238[lVar1] = local_238[lVar1] - local_438[lVar1 + 0x20];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    mul((int64_t *)(local_438 + 0x20),local_138,local_138);
    mul(local_1b8,(int64_t *)local_438,(int64_t *)local_438);
    mul((int64_t *)local_438,(int64_t *)(local_438 + 0x10),(int64_t *)local_438);
    mul((int64_t *)(local_438 + 0x10),(int64_t *)local_238,local_138);
    lVar1 = 0;
    do {
      local_138[lVar1] = local_438[lVar1 + 0x10] + local_438[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      local_438[lVar1] = local_438[lVar1] - local_438[lVar1 + 0x10];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    mul((int64_t *)local_238,(int64_t *)local_438,(int64_t *)local_438);
    lVar1 = 0;
    do {
      local_438[lVar1 + 0x10] = local_438[lVar1 + 0x20] - local_1b8[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    mul((int64_t *)local_438,(int64_t *)(local_438 + 0x10),_121665);
    lVar1 = 0;
    do {
      local_438[lVar1] = local_438[lVar1] + local_438[lVar1 + 0x20];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    mul((int64_t *)(local_438 + 0x10),(int64_t *)(local_438 + 0x10),(int64_t *)local_438);
    mul((int64_t *)local_438,(int64_t *)(local_438 + 0x20),local_1b8);
    mul((int64_t *)(local_438 + 0x20),(int64_t *)local_238,(int64_t *)local_b8);
    mul((int64_t *)local_238,local_138,local_138);
    lVar1 = 0;
    do {
      uVar5 = (local_238[lVar1] ^ local_438[lVar1]) & uVar8;
      local_438[lVar1] = local_438[lVar1] ^ uVar5;
      local_238[lVar1] = uVar5 ^ local_238[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      uVar5 = (local_438[lVar1 + 0x20] ^ local_438[lVar1 + 0x10]) & uVar8;
      local_438[lVar1 + 0x10] = local_438[lVar1 + 0x10] ^ uVar5;
      local_438[lVar1 + 0x20] = uVar5 ^ local_438[lVar1 + 0x20];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    bVar10 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar10);
  puVar7 = local_438 + 0x30;
  puVar6 = local_438 + 0x10;
  puVar9 = puVar7;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar9 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  iVar4 = 0xfd;
  do {
    mul((int64_t *)puVar7,(int64_t *)puVar7,(int64_t *)puVar7);
    if ((iVar4 != 2) && (iVar4 != 4)) {
      mul((int64_t *)puVar7,(int64_t *)puVar7,(int64_t *)(local_438 + 0x10));
    }
    bVar10 = iVar4 != 0;
    iVar4 = iVar4 + -1;
  } while (bVar10);
  puVar7 = local_438 + 0x30;
  puVar6 = local_438 + 0x10;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar6 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
  }
  mul((int64_t *)local_438,(int64_t *)local_438,(int64_t *)(local_438 + 0x10));
  car25519((int64_t *)local_438);
  car25519((int64_t *)local_438);
  car25519((int64_t *)local_438);
  lVar1 = 0;
  do {
    uVar8 = local_438[0] - 0xffed;
    local_438[0x30] = uVar8;
    lVar2 = 1;
    do {
      uVar5 = uVar8 & 0xffff;
      uVar8 = (((long)(uVar8 << 0x2f) >> 0x3f) + local_438[lVar2]) - 0xffff;
      local_438[lVar2 + 0x30] = uVar8;
      local_438[lVar2 + 0x2f] = uVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xf);
    uVar8 = (local_438[0xf] + ((long)(local_438[0x3e] << 0x2f) >> 0x3f)) - 0x7fff;
    local_438[0x3f] = uVar8;
    local_438[0x3e] = local_438[0x3e] & 0xffff;
    lVar2 = 0;
    do {
      uVar5 = (local_438[lVar2 + 0x30] ^ local_438[lVar2]) &
              (uVar8 >> 0x10 & 0xffff | 0xfffffffffffffffe) + 1;
      local_438[lVar2] = local_438[lVar2] ^ uVar5;
      local_438[lVar2 + 0x30] = uVar5 ^ local_438[lVar2 + 0x30];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    bVar10 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar10);
  lVar1 = 0;
  do {
    *(short *)(q + lVar1 * 2) = (short)local_438[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void cf_curve25519_mul(uint8_t *q, const uint8_t *n, const uint8_t *p)
{
  uint8_t z[32];
  gf x;
  gf a, b, c, d, e, f;

  {
  size_t i;
  for (i = 0; i < 31; i++)
    z[i] = n[i];
  z[31] = (n[31] & 127) | 64;
  z[0] &= 248;
  
  unpack25519(x, p);

  for(i = 0; i < 16; i++)
  {
    b[i] = x[i];
    d[i] = a[i] = c[i] = 0;
  }
  }

  a[0] = d[0] = 1;

  {int i;
  for (i = 254; i >= 0; i--)
  {
    int64_t r = (z[i >> 3] >> (i & 7)) & 1;
    sel25519(a, b, r);
    sel25519(c, d, r);
    add(e, a, c);
    sub(a, a, c);
    add(c, b, d);
    sub(b, b, d);
    sqr(d, e);
    sqr(f, a);
    mul(a, c, a);
    mul(c, b, e);
    add(e, a, c);
    sub(a, a, c);
    sqr(b, a);
    sub(c, d, f);
    mul(a, c, _121665);
    add(a, a, d);
    mul(c, c, a);
    mul(a, d, f);
    mul(d, b, x);
    sqr(b, e);
    sel25519(a, b, r);
    sel25519(c, d, r);
  }
  }

  inv25519(c, c);
  mul(a, a, c);
  pack25519(q, a);
}